

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMVel.cpp
# Opt level: O0

void __thiscall
OpenMD::COMVel::COMVel(COMVel *this,SimInfo *info,string *filename,string *sele1,string *sele2)

{
  string *in_RDI;
  string *in_stack_00000040;
  string *in_stack_00000048;
  string *in_stack_00000050;
  SimInfo *in_stack_00000058;
  SequentialAnalyzer *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string local_68 [32];
  string local_48 [72];
  
  SequentialAnalyzer::SequentialAnalyzer
            ((SequentialAnalyzer *)sele2,in_stack_00000058,in_stack_00000050,in_stack_00000048,
             in_stack_00000040);
  *(undefined ***)in_RDI = &PTR__COMVel_00394a58;
  this_00 = (SequentialAnalyzer *)&in_RDI[0x6a]._M_string_length;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x124787)
  ;
  getPrefix(in_stack_ffffffffffffff88);
  std::operator+(in_stack_ffffffffffffff88,(char *)this_00);
  SequentialAnalyzer::setOutputName(this_00,in_RDI);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

COMVel::COMVel(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2) :
      SequentialAnalyzer(info, filename, sele1, sele2) {
    setOutputName(getPrefix(filename) + ".comVel");
  }